

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateParallel::ArchiveIN(ChLinkMateParallel *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChLinkMateParallel>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  return;
}

Assistant:

void ChLinkMateParallel::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateParallel>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(flipped);
}